

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodetxb_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_111d3fd::EncodeTxbInitLevelTest::RunTest
          (EncodeTxbInitLevelTest *this,av1_txb_init_levels_func test_func,int tx_size,int is_speed)

{
  uint8_t uVar1;
  bool bVar2;
  int16_t iVar3;
  int iVar4;
  uint8_t *puVar5;
  Message *pMVar6;
  int in_ECX;
  code *in_RSI;
  double dVar7;
  double dVar8;
  AssertionResult gtest_ar;
  int c;
  int r;
  int stride;
  double t2;
  int i_3;
  double t1;
  int i_2;
  aom_usec_timer timer;
  int run_times;
  int i_1;
  int i;
  ACMRandom rnd;
  uint8_t *levels1;
  uint8_t *levels0;
  uint8_t levels_buf [2] [1312];
  tran_low_t coeff [4096];
  int height;
  int width;
  undefined4 in_stack_ffffffffffffb498;
  int in_stack_ffffffffffffb49c;
  AssertHelper *in_stack_ffffffffffffb4a0;
  Message *in_stack_ffffffffffffb4a8;
  Message *in_stack_ffffffffffffb4b0;
  Message *in_stack_ffffffffffffb4b8;
  tran_low_t *in_stack_ffffffffffffb4c0;
  Type type;
  AssertHelper *in_stack_ffffffffffffb4d0;
  int local_4b10;
  Message *in_stack_ffffffffffffb518;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_ffffffffffffb520;
  int local_4ad4;
  int local_4ad0;
  int local_4abc;
  int local_4aac;
  int local_4a84;
  int local_4a80;
  uint8_t local_4a68 [1312];
  uint8_t auStack_4548 [1312];
  int local_4028 [4098];
  uint local_20;
  uint local_1c;
  int local_18;
  code *local_10;
  
  local_18 = in_ECX;
  local_10 = in_RSI;
  local_1c = get_txb_wide('\0');
  local_20 = get_txb_high('\0');
  set_levels(local_4a68,local_20);
  puVar5 = set_levels(auStack_4548,local_20);
  libaom_test::ACMRandom::DeterministicSeed();
  libaom_test::ACMRandom::ACMRandom
            ((ACMRandom *)in_stack_ffffffffffffb4a0,in_stack_ffffffffffffb49c);
  for (local_4a80 = 0; local_4a80 < (int)(local_1c * local_20); local_4a80 = local_4a80 + 1) {
    iVar3 = libaom_test::ACMRandom::Rand16Signed((ACMRandom *)0xaec6a6);
    local_4028[local_4a80] = (int)iVar3;
  }
  for (local_4a84 = 0; local_4a84 < 0x520; local_4a84 = local_4a84 + 1) {
    uVar1 = libaom_test::ACMRandom::Rand8((ACMRandom *)in_stack_ffffffffffffb4a0);
    local_4a68[local_4a84] = uVar1;
    uVar1 = libaom_test::ACMRandom::Rand8((ACMRandom *)in_stack_ffffffffffffb4a0);
    auStack_4548[local_4a84] = uVar1;
  }
  if (local_18 == 0) {
    local_4b10 = 1;
  }
  else {
    local_4b10 = local_1c * local_20 * 10000;
  }
  ::aom_usec_timer_start((aom_usec_timer *)0xaec77a);
  for (local_4aac = 0; local_4aac < local_4b10; local_4aac = local_4aac + 1) {
    av1_txb_init_levels_c
              (in_stack_ffffffffffffb4c0,(int)((ulong)in_stack_ffffffffffffb4b8 >> 0x20),
               (int)in_stack_ffffffffffffb4b8,(uint8_t *)in_stack_ffffffffffffb4b0);
  }
  dVar7 = get_time_mark((aom_usec_timer *)0xaec7d8);
  ::aom_usec_timer_start((aom_usec_timer *)0xaec7ee);
  for (local_4abc = 0; local_4abc < local_4b10; local_4abc = local_4abc + 1) {
    (*local_10)(local_4028,local_1c,local_20,puVar5);
  }
  dVar8 = get_time_mark((aom_usec_timer *)0xaec851);
  if (local_18 != 0) {
    printf("init %3dx%-3d:%7.2f/%7.2fns",dVar7,dVar8,(ulong)local_1c,(ulong)local_20);
    printf("(%3.2f)\n",dVar7 / dVar8);
  }
  iVar4 = local_1c + 4;
  local_4ad0 = 0;
  do {
    if ((int)(local_20 + 4) <= local_4ad0) {
      return;
    }
    for (local_4ad4 = 0; local_4ad4 < iVar4; local_4ad4 = local_4ad4 + 1) {
      testing::internal::EqHelper::Compare<unsigned_char,_unsigned_char,_nullptr>
                ((char *)in_stack_ffffffffffffb4b8,(char *)in_stack_ffffffffffffb4b0,
                 (uchar *)in_stack_ffffffffffffb4a8,(uchar *)in_stack_ffffffffffffb4a0);
      bVar2 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xffffffffffffb518);
      if (!bVar2) {
        testing::Message::Message((Message *)in_stack_ffffffffffffb4d0);
        testing::Message::operator<<
                  ((Message *)in_stack_ffffffffffffb4a0,
                   (char (*) [2])CONCAT44(in_stack_ffffffffffffb49c,in_stack_ffffffffffffb498));
        testing::Message::operator<<
                  ((Message *)in_stack_ffffffffffffb4a0,
                   (int *)CONCAT44(in_stack_ffffffffffffb49c,in_stack_ffffffffffffb498));
        testing::Message::operator<<
                  ((Message *)in_stack_ffffffffffffb4a0,
                   (char (*) [2])CONCAT44(in_stack_ffffffffffffb49c,in_stack_ffffffffffffb498));
        in_stack_ffffffffffffb4d0 =
             (AssertHelper *)
             testing::Message::operator<<
                       ((Message *)in_stack_ffffffffffffb4a0,
                        (int *)CONCAT44(in_stack_ffffffffffffb49c,in_stack_ffffffffffffb498));
        pMVar6 = testing::Message::operator<<
                           ((Message *)in_stack_ffffffffffffb4a0,
                            (char (*) [3])
                            CONCAT44(in_stack_ffffffffffffb49c,in_stack_ffffffffffffb498));
        type = (Type)((ulong)pMVar6 >> 0x20);
        pMVar6 = testing::Message::operator<<
                           ((Message *)in_stack_ffffffffffffb4a0,
                            (int *)CONCAT44(in_stack_ffffffffffffb49c,in_stack_ffffffffffffb498));
        in_stack_ffffffffffffb4b8 =
             testing::Message::operator<<
                       ((Message *)in_stack_ffffffffffffb4a0,
                        (int *)CONCAT44(in_stack_ffffffffffffb49c,in_stack_ffffffffffffb498));
        in_stack_ffffffffffffb4b0 =
             testing::Message::operator<<
                       ((Message *)in_stack_ffffffffffffb4a0,
                        (char (*) [2])CONCAT44(in_stack_ffffffffffffb49c,in_stack_ffffffffffffb498))
        ;
        in_stack_ffffffffffffb4a8 =
             testing::Message::operator<<
                       ((Message *)in_stack_ffffffffffffb4a0,
                        (int *)CONCAT44(in_stack_ffffffffffffb49c,in_stack_ffffffffffffb498));
        in_stack_ffffffffffffb4a0 =
             (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0xaeca80);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_ffffffffffffb4d0,type,(char *)pMVar6,
                   (int)((ulong)in_stack_ffffffffffffb4b8 >> 0x20),(char *)in_stack_ffffffffffffb4b0
                  );
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)in_stack_ffffffffffffb520._M_head_impl,in_stack_ffffffffffffb518)
        ;
        testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffb4a0);
        testing::Message::~Message((Message *)0xaecace);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xaecb31);
      if (!bVar2) {
        return;
      }
    }
    local_4ad0 = local_4ad0 + 1;
  } while( true );
}

Assistant:

void EncodeTxbInitLevelTest::RunTest(av1_txb_init_levels_func test_func,
                                     int tx_size, int is_speed) {
  const int width = get_txb_wide((TX_SIZE)tx_size);
  const int height = get_txb_high((TX_SIZE)tx_size);
  tran_low_t coeff[MAX_TX_SQUARE];

  uint8_t levels_buf[2][TX_PAD_2D];
  uint8_t *const levels0 = set_levels(levels_buf[0], height);
  uint8_t *const levels1 = set_levels(levels_buf[1], height);

  ACMRandom rnd(ACMRandom::DeterministicSeed());
  for (int i = 0; i < width * height; i++) {
    coeff[i] = rnd.Rand16Signed();
  }
  for (int i = 0; i < TX_PAD_2D; i++) {
    levels_buf[0][i] = rnd.Rand8();
    levels_buf[1][i] = rnd.Rand8();
  }
  const int run_times = is_speed ? (width * height) * 10000 : 1;
  aom_usec_timer timer;
  aom_usec_timer_start(&timer);
  for (int i = 0; i < run_times; ++i) {
    av1_txb_init_levels_c(coeff, width, height, levels0);
  }
  const double t1 = get_time_mark(&timer);
  aom_usec_timer_start(&timer);
  for (int i = 0; i < run_times; ++i) {
    test_func(coeff, width, height, levels1);
  }
  const double t2 = get_time_mark(&timer);
  if (is_speed) {
    printf("init %3dx%-3d:%7.2f/%7.2fns", width, height, t1, t2);
    printf("(%3.2f)\n", t1 / t2);
  }
  const int stride = width + TX_PAD_HOR;
  for (int r = 0; r < height + TX_PAD_VER; ++r) {
    for (int c = 0; c < stride; ++c) {
      ASSERT_EQ(levels_buf[0][c + r * stride], levels_buf[1][c + r * stride])
          << "[" << r << "," << c << "] " << run_times << width << "x"
          << height;
    }
  }
}